

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_insert_seg(REF_CAVITY ref_cavity,REF_INT *nodes)

{
  REF_GRID pRVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  REF_INT *pRVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  int *piVar15;
  char *pcVar16;
  REF_INT ntri;
  REF_INT face_nodes [3];
  REF_INT face;
  REF_BOOL reversed;
  REF_INT tri_cell;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT local_8c;
  int local_88;
  int local_84;
  int local_80 [4];
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  ulong local_58;
  REF_NODE local_50;
  REF_GRID local_48;
  long local_40;
  long local_38;
  
  uVar5 = ref_cavity_find_seg(ref_cavity,nodes,&local_88,&local_68);
  if ((uVar5 == 0) || (uVar5 == 5)) {
    lVar9 = (long)local_88;
    if (lVar9 == -1) {
      if (ref_cavity->blankseg == -1) {
        iVar6 = ref_cavity->maxseg;
        iVar11 = 100;
        if (100 < (int)((double)iVar6 * 1.5)) {
          iVar11 = (int)((double)iVar6 * 1.5);
        }
        ref_cavity->maxseg = iVar11 + iVar6;
        fflush(_stdout);
        if (0 < ref_cavity->maxseg) {
          pRVar10 = (REF_INT *)realloc(ref_cavity->s2n,(ulong)(uint)ref_cavity->maxseg * 0xc);
          ref_cavity->s2n = pRVar10;
        }
        pRVar10 = ref_cavity->s2n;
        if (pRVar10 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x107,"ref_cavity_insert_seg","realloc ref_cavity->s2n NULL");
          uVar4 = (long)ref_cavity->maxseg * 3;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar4 & 0xffffffff,uVar4
                 ,4,(long)ref_cavity->maxseg * 0xc);
          return 2;
        }
        iVar11 = ref_cavity->maxseg;
        if (iVar6 < iVar11) {
          piVar15 = pRVar10 + (long)iVar6 * 3 + 1;
          lVar9 = (long)iVar6;
          do {
            piVar15[-1] = -1;
            lVar13 = lVar9 + 1;
            *piVar15 = (int)lVar9 + 1;
            iVar11 = ref_cavity->maxseg;
            piVar15 = piVar15 + 3;
            lVar9 = lVar13;
          } while (lVar13 < iVar11);
        }
        pRVar10[iVar11 * 3 + -2] = -1;
        ref_cavity->blankseg = iVar6;
      }
      local_88 = ref_cavity->blankseg;
      pRVar10 = ref_cavity->s2n;
      ref_cavity->blankseg = pRVar10[(long)local_88 * 3 + 1];
      lVar9 = 0;
      do {
        pRVar10[local_88 * 3 + lVar9] = nodes[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      pRVar10[(long)local_88 * 3 + 2] = nodes[2];
      ref_cavity->nseg = ref_cavity->nseg + 1;
      uVar5 = 0;
      if ((ref_cavity->tet_list->n != 0) && (ref_cavity->state == REF_CAVITY_UNKNOWN)) {
        iVar6 = ref_cavity->surf_node;
        iVar11 = iVar6;
        if (iVar6 == -1) {
          iVar11 = ref_cavity->node;
        }
        if (*nodes != iVar11) {
          iVar11 = iVar6;
          if (iVar6 == -1) {
            iVar11 = ref_cavity->node;
          }
          if (nodes[1] != iVar11) {
            if (iVar6 == -1) {
              iVar6 = ref_cavity->node;
            }
            local_80[0] = *nodes;
            local_80[1] = nodes[1];
            local_80[2] = iVar6;
            uVar5 = ref_cavity_insert_face(ref_cavity,local_80);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xad,"ref_cavity_add_seg_face",(ulong)uVar5,"add face for seg");
            }
          }
        }
      }
      if (uVar5 == 0) {
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x118,"ref_cavity_insert_seg",(ulong)uVar5,"add seg face");
      return uVar5;
    }
    if (local_68 == 0) {
      return 3;
    }
    pRVar10 = ref_cavity->s2n;
    if (nodes[2] == pRVar10[lVar9 * 3 + 2]) {
      pRVar10[lVar9 * 3] = -1;
      pRVar10[lVar9 * 3 + 1] = ref_cavity->blankseg;
      ref_cavity->blankseg = local_88;
      ref_cavity->nseg = ref_cavity->nseg + -1;
      uVar5 = 0;
      if ((ref_cavity->tet_list->n != 0) && (uVar5 = 0, ref_cavity->state == REF_CAVITY_UNKNOWN)) {
        local_80[0] = *nodes;
        local_80[1] = nodes[1];
        local_80[2] = ref_cavity->surf_node;
        if (local_80[2] == -1) {
          local_80[2] = ref_cavity->node;
        }
        uVar5 = ref_cavity_find_face(ref_cavity,local_80,local_80 + 3,&local_84);
        if (uVar5 == 0) {
          lVar9 = (long)local_80[3];
          if (lVar9 == -1) {
            pcVar16 = "face for a segment missing";
            uVar14 = 0x94;
          }
          else {
            if (local_84 != 0) {
              pRVar10 = ref_cavity->f2n;
              pRVar10[lVar9 * 3] = -1;
              pRVar10[lVar9 * 3 + 1] = ref_cavity->blankface;
              ref_cavity->blankface = local_80[3];
              ref_cavity->nface = ref_cavity->nface + -1;
              uVar5 = 0;
              goto LAB_001b5703;
            }
            pcVar16 = "face for a segment removal should be backwards";
            uVar14 = 0x95;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar14,"ref_cavity_remove_seg_face",pcVar16);
          uVar5 = 1;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x93,"ref_cavity_remove_seg_face",(ulong)uVar5,"find existing face for segment");
        }
      }
LAB_001b5703:
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0xf8,"ref_cavity_insert_seg",(ulong)uVar5,"rm seg face");
        return uVar5;
      }
      pRVar1 = ref_cavity->ref_grid;
      ref_cell = pRVar1->cell[8];
      if ((ref_cavity->seg_rm_adds_tet == 0) && (ref_cavity->tet_list->n == 0)) {
LAB_001b5b38:
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        if (ref_cavity->state == REF_CAVITY_UNKNOWN) {
          local_50 = pRVar1->node;
          uVar7 = ref_cell_list_with2(pRVar1->cell[3],*nodes,nodes[1],2,&local_84,local_80 + 3);
          if (uVar7 == 0) {
            local_48 = pRVar1;
            if ((long)local_84 != 2) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xc4,"ref_cavity_remove_seg_add_tets","cavity segment does not have two tri",2
                     ,(long)local_84);
              uVar7 = 1;
            }
            uVar5 = uVar7;
            if (local_84 == 2) {
              iVar6 = *nodes;
              local_58 = 0xffffffff;
              if (-1 < (long)iVar6) {
                local_58 = 0xffffffff;
                if (iVar6 < ref_cell->ref_adj->nnode) {
                  local_58 = (ulong)(uint)ref_cell->ref_adj->first[iVar6];
                }
              }
              uVar5 = 0;
              if ((int)local_58 != -1) {
                local_8c = ref_cell->ref_adj->item[(int)local_58].ref;
                do {
                  if (0 < ref_cell->node_per) {
                    iVar6 = 0;
                    do {
                      local_6c = iVar6;
                      if (nodes[1] == ref_cell->c2n[ref_cell->size_per * local_8c + local_6c]) {
                        uVar5 = ref_list_contains(ref_cavity->tet_list,local_8c,&local_5c);
                        if (uVar5 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0xca,"ref_cavity_remove_seg_add_tets",(ulong)uVar5,"have tet?");
                          goto LAB_001b5b3a;
                        }
                        if (local_5c == 0) {
                          uVar5 = ref_list_push(ref_cavity->tet_list,local_8c);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0xcc,"ref_cavity_remove_seg_add_tets",(ulong)uVar5,"save tet");
                            goto LAB_001b5b3a;
                          }
                          uVar5 = ref_cell_all_local(ref_cell,local_50,local_8c,&local_60);
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0xcd,"ref_cavity_remove_seg_add_tets",(ulong)uVar5,"local cell")
                            ;
                            goto LAB_001b5b3a;
                          }
                          if (local_60 == 0) {
                            ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                            goto LAB_001b5b38;
                          }
                          if (0 < ref_cell->face_per) {
                            lVar13 = 0;
                            lVar9 = 0;
                            do {
                              pRVar10 = ref_cell->c2n;
                              pRVar2 = ref_cell->f2n;
                              lVar12 = 0;
                              do {
                                local_80[lVar12] =
                                     pRVar10[(long)ref_cell->size_per * (long)local_8c +
                                             (long)*(int *)((long)pRVar2 + lVar12 * 4 + lVar13)];
                                lVar12 = lVar12 + 1;
                              } while (lVar12 != 3);
                              local_40 = lVar9;
                              local_38 = lVar13;
                              uVar8 = ref_cell_with(local_48->cell[3],local_80,&local_64);
                              if ((uVar8 != 0) && (uVar8 != 5)) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                       ,0xd8,"ref_cavity_remove_seg_add_tets",(ulong)uVar8,
                                       "search for boundary tri");
                                uVar7 = uVar8;
                              }
                              if ((uVar8 != 5) && (uVar5 = uVar7, uVar8 != 0)) goto LAB_001b5b3a;
                              if (((local_64 == -1) ||
                                  ((local_64 != local_80[3] && (local_64 != local_70)))) &&
                                 (uVar5 = ref_cavity_insert_face(ref_cavity,local_80), uVar5 != 0))
                              {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                       ,0xdd,"ref_cavity_remove_seg_add_tets",(ulong)uVar5,
                                       "tet face rm seg");
                                goto LAB_001b5b3a;
                              }
                              lVar9 = local_40 + 1;
                              lVar13 = local_38 + 0x10;
                            } while (lVar9 < ref_cell->face_per);
                          }
                        }
                      }
                      iVar6 = local_6c + 1;
                    } while (local_6c + 1 < ref_cell->node_per);
                  }
                  pRVar3 = ref_cell->ref_adj->item;
                  iVar6 = pRVar3[(int)local_58].next;
                  local_58 = (ulong)iVar6;
                  if (local_58 == 0xffffffffffffffff) {
                    local_8c = -1;
                  }
                  else {
                    local_8c = pRVar3[local_58].ref;
                  }
                  uVar5 = 0;
                } while (iVar6 != -1);
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xc3,"ref_cavity_remove_seg_add_tets",(ulong)uVar7,"tri with2");
            uVar5 = uVar7;
          }
        }
      }
LAB_001b5b3a:
      if (uVar5 != 0) {
        pcVar16 = "rm seg tets";
        uVar14 = 0xf9;
        goto LAB_001b544f;
      }
    }
    else {
      ref_cavity->state = REF_CAVITY_BOUNDARY_CONSTRAINED;
    }
    uVar5 = 0;
  }
  else {
    pcVar16 = "find existing";
    uVar14 = 0xea;
LAB_001b544f:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar14
           ,"ref_cavity_insert_seg",(ulong)uVar5,pcVar16);
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_insert_seg(REF_CAVITY ref_cavity,
                                         REF_INT *nodes) {
  REF_INT node, seg;
  REF_INT orig, chunk;
  REF_BOOL reversed;

  RXS(ref_cavity_find_seg(ref_cavity, nodes, &seg, &reversed), REF_NOT_FOUND,
      "find existing");

  if (REF_EMPTY != seg) {
    if (reversed) { /* two segs with opposite orientation destroy each other */
      if (nodes[2] != ref_cavity_s2n(ref_cavity, 2, seg)) {
        /* mixing faceid would violate topology */
        ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
        return REF_SUCCESS;
      }
      ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
      ref_cavity_s2n(ref_cavity, 1, seg) = ref_cavity_blankseg(ref_cavity);
      ref_cavity_blankseg(ref_cavity) = seg;

      ref_cavity_nseg(ref_cavity)--;
      RSS(ref_cavity_remove_seg_face(ref_cavity, nodes), "rm seg face");
      RSS(ref_cavity_remove_seg_add_tets(ref_cavity, nodes), "rm seg tets");

      return REF_SUCCESS;
    } else { /* can't happen, added same seg twice */
      return REF_INVALID;
    }
  }

  /* if I need to grow my array of segs */
  if (REF_EMPTY == ref_cavity_blankseg(ref_cavity)) {
    orig = ref_cavity_maxseg(ref_cavity);
    chunk = MAX(100, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_cavity_maxseg(ref_cavity) = orig + chunk;

    ref_realloc(ref_cavity->s2n, 3 * ref_cavity_maxseg(ref_cavity), REF_INT);

    for (seg = orig; seg < ref_cavity_maxseg(ref_cavity); seg++) {
      ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
      ref_cavity_s2n(ref_cavity, 1, seg) = seg + 1;
    }
    ref_cavity_s2n(ref_cavity, 1, (ref_cavity->maxseg) - 1) = REF_EMPTY;
    ref_cavity_blankseg(ref_cavity) = orig;
  }

  seg = ref_cavity_blankseg(ref_cavity);
  ref_cavity_blankseg(ref_cavity) = ref_cavity_s2n(ref_cavity, 1, seg);
  for (node = 0; node < 2; node++)
    ref_cavity_s2n(ref_cavity, node, seg) = nodes[node];
  ref_cavity_s2n(ref_cavity, 2, seg) = nodes[2]; /* faceid */

  ref_cavity_nseg(ref_cavity)++;
  RSS(ref_cavity_add_seg_face(ref_cavity, nodes), "add seg face");

  return REF_SUCCESS;
}